

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O3

void __thiscall klogic::mlmvn_forward_base::start(mlmvn_forward_base *this,cvector *X,iterator _out)

{
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            (&this->layer1,(long)this->net->max_layer_size);
  if (1 < (ulong)(((long)(this->net->neurons).
                         super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->net->neurons).
                         super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
              (&this->layer2,
               (long)(this->layer1).
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->layer1).
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
  }
  this->from = X;
  this->to = &this->layer1;
  this->from_size =
       (long)(X->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(X->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start >> 4;
  (this->out)._M_current = _out._M_current;
  this->use_out = true;
  this->layer = 0;
  return;
}

Assistant:

void klogic::mlmvn_forward_base::start(const klogic::cvector &X, cvector::iterator _out)
{
    layer1.resize(net.max_layer_size);

    // Allocate memory for 1 or 2 layers
    if (net.layers_count() > 1)
        layer2.resize(layer1.size());

    from = &X;
    to = &layer1;
    from_size = X.size();

    out = _out;
    use_out = true;
    layer = 0;
}